

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_CloseDoor(FParser *this)

{
  bool bVar1;
  int tag;
  int iVar2;
  int iVar3;
  double speed;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    tag = intvalue(this->t_argv);
    if (tag != 0) {
      if (this->t_argc < 2) {
        speed = 2.0;
      }
      else {
        iVar2 = intvalue(this->t_argv + 1);
        iVar3 = 0x7f;
        if (iVar2 < 0x7f) {
          iVar3 = iVar2;
        }
        iVar2 = 1;
        if (1 < iVar3) {
          iVar2 = iVar3;
        }
        speed = (double)(iVar2 * 2);
      }
      EV_DoDoor(doorClose,(line_t_conflict *)0x0,(AActor *)0x0,tag,speed,0,0,0,false,0);
    }
  }
  return;
}

Assistant:

void FParser::SF_CloseDoor(void)
{
	int speed;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door speed
		if(t_argc > 1) speed = intvalue(t_argv[1]);
		else speed = 1;    // 1= normal speed
		
		EV_DoDoor(DDoor::doorClose, NULL, NULL, sectag, 2.*clamp(speed, 1, 127), 0, 0, 0);
	}
}